

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeWebAssemblyObject
               (DynamicObject *webAssemblyObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  DynamicObject *pDVar1;
  RuntimeFunction *pRVar2;
  StaticType *type;
  LiteralString *pLVar3;
  uint uVar5;
  ulong uVar4;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  this = (((webAssemblyObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  DeferredTypeHandlerBase::Convert(typeHandler,webAssemblyObject,mode,10,0);
  pDVar1 = CreateObject(this,true,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WabtInterface::EntryInfo::ConvertWast2Wasm,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xf3);
  uVar4 = (ulong)uVar5 << 0x20;
  (*(pDVar1->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(pDVar1,0xf3,pRVar2,6,0,0,uVar4);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xf2,pDVar1,0,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::Compile,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x19f);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0x19f,pRVar2,6,0,0,uVar4);
  Memory::Recycler::WBSetBit((char *)&this->webAssemblyCompileFunction);
  (this->webAssemblyCompileFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyCompileFunction);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::CompileStreaming,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xe1);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xe1,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::Validate,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xe0);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xe0,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::Instantiate,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xe2);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xe2,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::InstantiateStreaming,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xe3);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xe3,pRVar2,6,0,0,uVar4);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::QueryResponse,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  Memory::Recycler::WBSetBit((char *)&this->webAssemblyQueryResponseFunction);
  (this->webAssemblyQueryResponseFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyQueryResponseFunction);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::InstantiateBound,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  Memory::Recycler::WBSetBit((char *)&this->webAssemblyInstantiateBoundFunction);
  (this->webAssemblyInstantiateBoundFunction).ptr = &pRVar2->super_JavascriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->webAssemblyInstantiateBoundFunction);
  pRVar2 = (this->webAssemblyModuleConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xd9,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000d9);
  pRVar2 = (this->webAssemblyInstanceConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xda,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000da);
  pRVar2 = (this->webAssemblyCompileErrorConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xdd,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000dd);
  pRVar2 = (this->webAssemblyRuntimeErrorConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xde,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000de);
  pRVar2 = (this->webAssemblyLinkErrorConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xdf,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000df);
  pRVar2 = (this->webAssemblyMemoryConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xdb,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000db);
  pRVar2 = (this->webAssemblyTableConstructor).ptr;
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xdc,pRVar2,6,0,0,uVar4);
  RuntimeFunction::SetFunctionNameId(pRVar2,&DAT_10000000000dc);
  type = StringCache::GetStringTypeStatic(&this->stringCache);
  pLVar3 = LiteralString::New(type,L"WebAssembly",0xb,this->recycler);
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (webAssemblyObject,0x1b,pLVar3,2,0,0,uVar4 & 0xffffffff00000000);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyObject(DynamicObject* webAssemblyObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = webAssemblyObject->GetLibrary();
        int slots = 9;
#ifdef ENABLE_WABT
        // Attaching wabt for testing
        ++slots;
#endif
        typeHandler->Convert(webAssemblyObject, mode, slots);

#ifdef ENABLE_WABT
        // Build wabt object
        Js::DynamicObject* wabtObject = library->CreateObject(true);
        library->AddFunctionToLibraryObject(wabtObject, PropertyIds::convertWast2Wasm, &WabtInterface::EntryInfo::ConvertWast2Wasm, 1);
        library->AddMember(webAssemblyObject, PropertyIds::wabt, wabtObject, PropertyNone);
#endif
        library->webAssemblyCompileFunction =
            library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compile, &WebAssembly::EntryInfo::Compile, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compileStreaming, &WebAssembly::EntryInfo::CompileStreaming, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::validate, &WebAssembly::EntryInfo::Validate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiate, &WebAssembly::EntryInfo::Instantiate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiateStreaming, &WebAssembly::EntryInfo::InstantiateStreaming, 1);
        library->webAssemblyQueryResponseFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::QueryResponse, 1, nullptr, nullptr, PropertyIds::undefined);
        library->webAssemblyInstantiateBoundFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::InstantiateBound, 1, nullptr, nullptr, PropertyIds::undefined);

        library->AddFunction(webAssemblyObject, PropertyIds::Module, library->webAssemblyModuleConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::Instance, library->webAssemblyInstanceConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::CompileError, library->webAssemblyCompileErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::RuntimeError, library->webAssemblyRuntimeErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::LinkError, library->webAssemblyLinkErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Memory, library->webAssemblyMemoryConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Table, library->webAssemblyTableConstructor);

        library->AddMember(webAssemblyObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly")), PropertyConfigurable);

        return true;
    }